

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O1

void sexp_print_simple(sexp_conflict ctx,sexp_conflict x,sexp_conflict out,int depth)

{
  uint uVar1;
  sexp psVar2;
  sexp psVar3;
  bool bVar4;
  
  if ((((ulong)x & 3) != 0) ||
     ((uVar1 = x->tag, uVar1 < 0xd && ((0x1a80U >> (uVar1 & 0x1f) & 1) != 0)))) {
    sexp_write_op(ctx,0,2,x,out);
    return;
  }
  if (0 < depth) {
    if (uVar1 == 6) {
      psVar2 = (out->value).type.setters;
      if (psVar2 == (sexp)0x0) {
        putc(0x28,(FILE *)(out->value).type.getters);
      }
      else {
        psVar3 = (out->value).type.print;
        if (psVar3 < (sexp)(out->value).port.size) {
          (out->value).type.print = (sexp)((long)&psVar3->tag + 1);
          *(undefined1 *)((long)&psVar3->tag + (long)&psVar2->tag) = 0x28;
        }
        else {
          sexp_buffered_write_char(ctx,0x28,out);
        }
      }
      sexp_print_simple(ctx,(x->value).type.name,out,depth + -1);
      if ((out->value).type.setters == (sexp)0x0) {
        fputs(" . ",(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string(ctx," . ",out);
      }
      sexp_print_simple(ctx,(x->value).type.cpl,out,depth + -1);
LAB_00101a45:
      psVar2 = (out->value).type.setters;
      if (psVar2 == (sexp)0x0) {
        putc(0x29,(FILE *)(out->value).type.getters);
        return;
      }
      psVar3 = (out->value).type.print;
      if ((sexp)(out->value).port.size <= psVar3) {
        sexp_buffered_write_char(ctx,0x29,out);
        return;
      }
      (out->value).type.print = (sexp)((long)&psVar3->tag + 1);
      *(undefined1 *)((long)&psVar3->tag + (long)&psVar2->tag) = 0x29;
      return;
    }
    if (uVar1 == 10) {
      if ((out->value).type.setters == (sexp)0x0) {
        fputs("#(",(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string(ctx,"#(",out);
      }
      bVar4 = 0 < *(int *)&x->value;
      if (bVar4) {
        sexp_print_simple(ctx,(x->value).type.cpl,out,depth + -1);
      }
      if ((int)(uint)bVar4 < *(int *)&x->value) {
        if ((out->value).type.setters == (sexp)0x0) {
          fputs(" ...",(FILE *)(out->value).type.getters);
        }
        else {
          sexp_buffered_write_string(ctx," ...",out);
        }
      }
      goto LAB_00101a45;
    }
    if (uVar1 == 0x16) {
      if ((out->value).type.setters == (sexp)0x0) {
        fputs("#<sc ",(FILE *)(out->value).type.getters);
      }
      else {
        sexp_buffered_write_string(ctx,"#<sc ",out);
      }
      sexp_print_simple(ctx,(x->value).type.slots,out,depth);
      goto LAB_001019a9;
    }
  }
  if ((out->value).type.setters == (sexp)0x0) {
    fputs("#<",(FILE *)(out->value).type.getters);
  }
  else {
    sexp_buffered_write_string(ctx,"#<",out);
  }
  sexp_write_op(ctx,0,2,*(undefined8 *)
                         (*(long *)((long)&((((ctx->value).type.setters)->value).type.getters)->
                                           value + (ulong)x->tag * 8 + 8) + 8),out);
LAB_001019a9:
  if ((out->value).type.setters == (sexp)0x0) {
    fputs(">",(FILE *)(out->value).type.getters);
    return;
  }
  sexp_buffered_write_string(ctx,">",out);
  return;
}

Assistant:

static void sexp_print_simple (sexp ctx, sexp x, sexp out, int depth) {
  int i;
  if ((!sexp_pointerp(x)) || sexp_symbolp(x) || sexp_stringp(x)
      || sexp_flonump(x) || sexp_bignump(x)) {
    sexp_write(ctx, x, out);
  } else if (depth <= 0) {
    goto print_name;
  } else if (sexp_synclop(x)) {
    sexp_write_string(ctx, "#<sc ", out);
    sexp_print_simple(ctx, sexp_synclo_expr(x), out, depth);
    sexp_write_string(ctx, ">", out);
  } else if (sexp_pairp(x)) {
    sexp_write_char(ctx, '(', out);
    sexp_print_simple(ctx, sexp_car(x), out, depth-1);
    sexp_write_string(ctx, " . ", out);
    sexp_print_simple(ctx, sexp_cdr(x), out, depth-1);
    sexp_write_char(ctx, ')', out);
  } else if (sexp_vectorp(x)) {
    sexp_write_string(ctx, "#(", out);
    for (i=0; i<SEXP_HEAP_VECTOR_DEPTH && i<(int)sexp_vector_length(x); i++) {
      if (i>0)
        sexp_write_char(ctx, ' ', out);
      sexp_print_simple(ctx, sexp_vector_ref(x, i), out, depth-1);
    }
    if (i<(int)sexp_vector_length(x))
      sexp_write_string(ctx, " ...", out);
    sexp_write_char(ctx, ')', out);
  } else {
  print_name:
    sexp_write_string(ctx, "#<", out);
    sexp_write(ctx, sexp_object_type_name(ctx, x), out);
    sexp_write_string(ctx, ">", out);
  }
}